

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O2

ASTObject * __thiscall
soul::RewritingASTVisitor::visit(RewritingASTVisitor *this,EndpointDeclaration *e)

{
  EndpointDetails *pEVar1;
  ChildEndpointPath *pCVar2;
  pool_ref<soul::AST::Expression> *type;
  pool_ref<soul::AST::Expression> *e_00;
  long lVar3;
  PathSection *p;
  PathSection *pPVar4;
  
  pEVar1 = (e->details).object;
  if (pEVar1 != (EndpointDetails *)0x0) {
    e_00 = (pEVar1->dataTypes).items;
    for (lVar3 = (pEVar1->dataTypes).numActive << 3; lVar3 != 0; lVar3 = lVar3 + -8) {
      replaceExpression(this,e_00);
      e_00 = e_00 + 1;
    }
    replaceExpression(this,&pEVar1->arraySize);
  }
  if ((e->childPath).object != (ChildEndpointPath *)0x0) {
    pCVar2 = pool_ptr<soul::AST::ChildEndpointPath>::operator->(&e->childPath);
    pPVar4 = (pCVar2->sections).items;
    for (lVar3 = (pCVar2->sections).numActive << 4; lVar3 != 0; lVar3 = lVar3 + -0x10) {
      replaceExpression(this,&pPVar4->index);
      pPVar4 = pPVar4 + 1;
    }
  }
  (*this->_vptr_RewritingASTVisitor[8])(this,&e->annotation);
  return &e->super_ASTObject;
}

Assistant:

virtual AST::ASTObject& visit (AST::EndpointDeclaration& e)
    {
        if (auto details = e.details.get())
        {
            for (auto& type : details->dataTypes)
                replaceExpression (type);

            replaceExpression (details->arraySize);
        }

        if (e.childPath != nullptr)
            for (auto& p : e.childPath->sections)
                replaceExpression (p.index);

        visit (e.annotation);
        return e;
    }